

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SchemaValidator::preContentValidation
          (SchemaValidator *this,bool param_1,bool validateDefAttr)

{
  short *psVar1;
  CreateReasons CVar2;
  void *__src;
  XercesGroupInfo *pXVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  SchemaGrammar *aGrammar;
  SchemaElementDecl *pSVar7;
  XMLCh *pXVar8;
  long *plVar9;
  ulong uVar10;
  long *plVar11;
  char16_t *toDelete;
  undefined4 extraout_var_01;
  ComplexTypeInfo *this_00;
  XercesGroupInfo *curGroup;
  XMLScanner *this_01;
  size_t __n;
  Codes toEmit;
  char16_t *text2;
  ulong local_118;
  ArrayJanitor<char16_t> janList;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *local_e8;
  XMLSize_t local_e0;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *local_d8;
  RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> groupEnum;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> elemEnum;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16_t *pcVar12;
  
  GrammarResolver::getGrammarEnumerator(&grammarEnum,this->fGrammarResolver);
LAB_003175c1:
  do {
    if ((grammarEnum.fCurElem == (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) &&
       (grammarEnum.fCurHash == (grammarEnum.fToEnum)->fHashModulus)) {
      RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator(&grammarEnum);
      return;
    }
    aGrammar = (SchemaGrammar *)
               RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
               nextElement(&grammarEnum);
    iVar6 = (*(aGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[5])(aGrammar);
  } while ((iVar6 != 1) ||
          (iVar6 = (*(aGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[7])(aGrammar)
          , (char)iVar6 != '\0'));
  (*(aGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x13])(aGrammar,1);
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
  RefHash3KeysIdPoolEnumerator(&elemEnum,aGrammar->fElemDeclPool,false,aGrammar->fMemoryManager);
  do {
    if ((elemEnum.fCurIndex == 0) || ((elemEnum.fToEnum)->fIdCounter < elemEnum.fCurIndex)) break;
    pSVar7 = RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
             ::nextElement(&elemEnum);
    CVar2 = (pSVar7->super_XMLElementDecl).fCreateReason;
    if (CVar2 == AsRootElem) {
      pXVar8 = QName::getRawName((pSVar7->super_XMLElementDecl).fElementName);
      XMLValidator::emitError
                (&this->super_XMLValidator,UndeclaredElemInDocType,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    else {
      if (CVar2 == InContentModel) {
        this_01 = (this->super_XMLValidator).fScanner;
        pXVar8 = QName::getRawName((pSVar7->super_XMLElementDecl).fElementName);
        toEmit = UndeclaredElemInCM;
      }
      else {
        if (CVar2 != AttList) goto LAB_003176dd;
        this_01 = (this->super_XMLValidator).fScanner;
        pXVar8 = QName::getRawName((pSVar7->super_XMLElementDecl).fElementName);
        toEmit = UndeclaredElemInAttList;
      }
      XMLScanner::emitError(this_01,toEmit,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
LAB_003176dd:
    iVar6 = (*(pSVar7->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(pSVar7);
    if ((char)iVar6 != '\0') {
      iVar6 = (*(pSVar7->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])(pSVar7);
      plVar9 = (long *)CONCAT44(extraout_var,iVar6);
      bVar4 = false;
      for (local_118 = 0; uVar10 = (**(code **)(*plVar9 + 0x50))(plVar9), local_118 < uVar10;
          local_118 = local_118 + 1) {
        plVar11 = (long *)(**(code **)(*plVar9 + 0x58))(plVar9);
        bVar5 = bVar4;
        if (*(int *)((long)plVar11 + 0xc) == 8) {
          __src = (void *)plVar11[5];
          if (__src != (void *)0x0) {
            __n = 0;
            do {
              psVar1 = (short *)((long)__src + __n);
              __n = __n + 2;
            } while (*psVar1 != 0);
            iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
            toDelete = (char16_t *)CONCAT44(extraout_var_00,iVar6);
            memcpy(toDelete,__src,__n);
            ArrayJanitor<char16_t>::ArrayJanitor(&janList,toDelete,this->fMemoryManager);
            text2 = toDelete;
LAB_003177b8:
            do {
              pcVar12 = toDelete;
              toDelete = pcVar12 + 1;
              if (*pcVar12 == L'\0') {
                bVar4 = true;
              }
              else {
                if (*pcVar12 != L' ') goto LAB_003177b8;
                *pcVar12 = L'\0';
                bVar4 = false;
              }
              iVar6 = (*(aGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xf])
                                (aGrammar,text2);
              if (CONCAT44(extraout_var_01,iVar6) == 0) {
                pXVar8 = (XMLCh *)(**(code **)(*plVar11 + 0x28))(plVar11);
                XMLValidator::emitError
                          (&this->super_XMLValidator,UnknownNotRefAttr,pXVar8,text2,(XMLCh *)0x0,
                           (XMLCh *)0x0);
              }
              text2 = toDelete;
            } while (!bVar4);
            ArrayJanitor<char16_t>::~ArrayJanitor(&janList);
          }
        }
        else if ((*(int *)((long)plVar11 + 0xc) == 1) && (bVar5 = true, bVar4)) {
          pXVar8 = QName::getRawName((pSVar7->super_XMLElementDecl).fElementName);
          XMLValidator::emitError
                    (&this->super_XMLValidator,MultipleIdAttrs,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          break;
        }
        bVar4 = bVar5;
        if ((validateDefAttr) && (plVar11[4] != 0)) {
          (*(this->super_XMLValidator)._vptr_XMLValidator[8])(this,plVar11);
        }
      }
    }
  } while( true );
  if (((this->super_XMLValidator).fScanner)->fSchemaFullChecking == true) {
    RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)
               &janList,aGrammar->fComplexTypeRegistry,false,this->fMemoryManager);
    while ((local_e8 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0 ||
           (local_e0 != local_d8->fHashModulus))) {
      this_00 = RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::
                nextElement((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>
                             *)&janList);
      ComplexTypeInfo::checkUniqueParticleAttribution
                (this_00,aGrammar,this->fGrammarResolver,this->fGrammarResolver->fStringPool,
                 &this->super_XMLValidator);
      checkParticleDerivation(this,aGrammar,this_00);
      checkRefElementConsistency(this,aGrammar,this_00,(XercesGroupInfo *)0x0);
    }
    RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator(&groupEnum,aGrammar->fGroupInfoRegistry,false,this->fMemoryManager);
    while ((groupEnum.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0 ||
           (groupEnum.fCurHash != (groupEnum.fToEnum)->fHashModulus))) {
      curGroup = RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
                 nextElement(&groupEnum);
      pXVar3 = curGroup->fBaseGroup;
      if (pXVar3 != (XercesGroupInfo *)0x0) {
        checkParticleDerivationOk
                  (this,aGrammar,curGroup->fContentSpec,curGroup->fScope,pXVar3->fContentSpec,
                   pXVar3->fScope,(ComplexTypeInfo *)0x0,true);
      }
      if (curGroup->fCheckElementConsistency == true) {
        checkRefElementConsistency(this,aGrammar,(ComplexTypeInfo *)0x0,curGroup);
      }
    }
    RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&groupEnum);
    RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)
               &janList);
  }
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
  ~RefHash3KeysIdPoolEnumerator(&elemEnum);
  goto LAB_003175c1;
}

Assistant:

void SchemaValidator::preContentValidation(bool,
                                           bool validateDefAttr)
{
    //  Lets go through all the grammar in the GrammarResolver
    //    and validate those that has not been validated yet
    //
    //  Lets enumerate all of the elements in the element decl pool
    //    and put out an error for any that did not get declared.
    //    We also check all of the attributes as well.
    //
    //  And enumerate all the complextype info in the grammar
    //    and do Unique Particle Attribution Checking

    RefHashTableOfEnumerator<Grammar> grammarEnum = fGrammarResolver->getGrammarEnumerator();
    while (grammarEnum.hasMoreElements())
    {
        Grammar& grammar = grammarEnum.nextElement();
        if (grammar.getGrammarType() != Grammar::SchemaGrammarType || grammar.getValidated())
             continue;
        SchemaGrammar& sGrammar = (SchemaGrammar&) grammar;
        sGrammar.setValidated(true);

        RefHash3KeysIdPoolEnumerator<SchemaElementDecl> elemEnum = sGrammar.getElemEnumerator();

        while (elemEnum.hasMoreElements())
        {
            SchemaElementDecl& curElem = elemEnum.nextElement();

            //  First check if declared or not
            //
            //  See if this element decl was ever marked as declared. If
            //  not, then put out an error. In some cases its just
            //  a warning, such as being referenced in a content model.
            //
            const SchemaElementDecl::CreateReasons reason = curElem.getCreateReason();

            if (reason != XMLElementDecl::Declared)
            {
                if (reason == XMLElementDecl::AttList)
                {
                    getScanner()->emitError
                    (
                        XMLErrs::UndeclaredElemInAttList
                        , curElem.getFullName()
                    );
                }
                 else if (reason == XMLElementDecl::AsRootElem)
                {
                    emitError
                    (
                        XMLValid::UndeclaredElemInDocType
                        , curElem.getFullName()
                    );
                }
                 else if (reason == XMLElementDecl::InContentModel)
                {
                    getScanner()->emitError
                    (
                        XMLErrs::UndeclaredElemInCM
                        , curElem.getFullName()
                    );
                }
                else
                {
                }
            }

            //
            //  Then check all of the attributes of the current element.
            //  We check for:
            //
            //  1) Multiple ID attributes
            //  2) That all of the default values of attributes are
            //      valid for their type.
            //  3) That for any notation types, that their lists
            //      of possible values refer to declared notations.
            //
            if (curElem.hasAttDefs()) {
                XMLAttDefList& attDefList = curElem.getAttDefList();
                bool seenId = false;

                for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
                {
                    const XMLAttDef& curAttDef = attDefList.getAttDef(i);

                    if (curAttDef.getType() == XMLAttDef::ID)
                    {
                        if (seenId)
                        {
                            emitError
                            (
                                XMLValid::MultipleIdAttrs
                                , curElem.getFullName()
                            );
                            break;
                        }

                        seenId = true;
                    }
                     else if (curAttDef.getType() == XMLAttDef::Notation && curAttDef.getEnumeration())
                    {
                        //
                        //  We need to verify that all of its possible values
                        //  (in the enum list) refer to valid notations.
                        //
                        XMLCh* list = XMLString::replicate(curAttDef.getEnumeration(), fMemoryManager);
                        ArrayJanitor<XMLCh> janList(list, fMemoryManager);

                        //
                        //  Search forward for a space or a null. If a null,
                        //  we are done. If a space, cap it and look it up.
                        //
                        bool    breakFlag = false;
                        XMLCh*  listPtr = list;
                        XMLCh*  lastPtr = listPtr;
                        while (true)
                        {
                            while (*listPtr && (*listPtr != chSpace))
                                listPtr++;

                            //
                            //  If at the end, indicate we need to break after
                            //  this one. Else, cap it off here.
                            //
                            if (!*listPtr)
                                breakFlag = true;
                            else
                                *listPtr = chNull;

                            if (!sGrammar.getNotationDecl(lastPtr))
                            {
                                emitError
                                (
                                    XMLValid::UnknownNotRefAttr
                                    , curAttDef.getFullName()
                                    , lastPtr
                                );
                            }

                            // Break out if we hit the end last time
                            if (breakFlag)
                                break;

                            // Else move upwards and try again
                            listPtr++;
                            lastPtr = listPtr;
                        }
                    }

                    // If it has a default/fixed value, then validate it
                    if (validateDefAttr && curAttDef.getValue())
                    {
                        validateAttrValue
                        (
                            &curAttDef
                            , curAttDef.getValue()
                            , true
                            , &curElem
                        );
                    }
                }
            }
        }

        //  For each complex type info, check the Unique Particle Attribution
        if (getScanner()->getValidationSchemaFullChecking()) {
            RefHashTableOf<ComplexTypeInfo>* complexTypeRegistry = sGrammar.getComplexTypeRegistry();

            RefHashTableOfEnumerator<ComplexTypeInfo> complexTypeEnum(complexTypeRegistry, false, fMemoryManager);
            while (complexTypeEnum.hasMoreElements())
            {
                ComplexTypeInfo& curTypeInfo = complexTypeEnum.nextElement();
                curTypeInfo.checkUniqueParticleAttribution(&sGrammar, fGrammarResolver, fGrammarResolver->getStringPool(), this);
                checkParticleDerivation(&sGrammar, &curTypeInfo);
                checkRefElementConsistency(&sGrammar, &curTypeInfo);
            }

            RefHashTableOf<XercesGroupInfo>* groupInfoRegistry = sGrammar.getGroupInfoRegistry();
            RefHashTableOfEnumerator<XercesGroupInfo> groupEnum(groupInfoRegistry, false, fMemoryManager);

            while (groupEnum.hasMoreElements()) {

                XercesGroupInfo& curGroup = groupEnum.nextElement();
                XercesGroupInfo* baseGroup = curGroup.getBaseGroup();

                if (baseGroup) {
                    try {
                        checkParticleDerivationOk(&sGrammar, curGroup.getContentSpec(), curGroup.getScope(),
                                                  baseGroup->getContentSpec(), baseGroup->getScope());
                    }
                    catch (const XMLException& excep) {
                        fSchemaErrorReporter.emitError(excep, curGroup.getLocator());
					}
                }

                if (curGroup.getCheckElementConsistency())
                    checkRefElementConsistency(&sGrammar, 0, &curGroup);
            }
        }
    }
}